

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

void __thiscall
dlib::resizable_tensor::resizable_tensor(resizable_tensor *this,resizable_tensor *item)

{
  int iVar1;
  undefined4 extraout_var;
  size_t __n;
  undefined1 auVar2 [32];
  
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->super_tensor).m_n = auVar2._0_8_;
  (this->super_tensor).m_k = auVar2._8_8_;
  (this->super_tensor).m_nr = auVar2._16_8_;
  (this->super_tensor).m_nc = auVar2._24_8_;
  (this->super_tensor).m_size = 0;
  (this->data_instance).data_size = 0;
  (this->super_tensor)._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fa338;
  (this->data_instance).host_current = true;
  (this->data_instance).device_current = true;
  (this->data_instance).have_active_transfer = false;
  (this->data_instance).device_in_use = false;
  (this->data_instance).data_host = (shared_ptr<float>)auVar2._0_16_;
  (this->data_instance).data_device = (shared_ptr<float>)auVar2._16_16_;
  *(undefined1 (*) [32])
   ((long)&(this->data_instance).data_device.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 4) = ZEXT1632(ZEXT816(0) << 0x40);
  iVar1 = (*(item->super_tensor)._vptr_tensor[8])(item);
  te::storage_heap::storage_heap
            (&(this->_annotation).storage,(storage_heap *)CONCAT44(extraout_var,iVar1));
  copy_size(this,&item->super_tensor);
  memcpy(this,item,__n);
  return;
}

Assistant:

resizable_tensor(const resizable_tensor& item) : _annotation(item.annotation()) 
        {
            copy_size(item);
            memcpy(*this, item);
        }